

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int rd_contents_init(archive_read *a,enctype encoding,int a_sum_alg,int e_sum_alg)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  archive_digest *paVar5;
  char *pcVar6;
  long lVar7;
  
  pvVar1 = a->format->data;
  *(enctype *)((long)pvVar1 + 0x60) = encoding;
  bVar2 = true;
  if (encoding - LZMA < 2) {
    if (*(int *)((long)pvVar1 + 0x168) != 0) {
      lzma_end((long)pvVar1 + 0xe0);
      *(undefined4 *)((long)pvVar1 + 0x168) = 0;
    }
    if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
      iVar3 = lzma_stream_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff,8);
    }
    else {
      iVar3 = lzma_alone_decoder((long)pvVar1 + 0xe0,0xffffffffffffffff);
    }
    if (iVar3 == 0) {
      *(undefined4 *)((long)pvVar1 + 0x168) = 1;
      encoding = NONE;
      *(undefined8 *)((long)pvVar1 + 0xf0) = 0;
      *(undefined8 *)((long)pvVar1 + 0x108) = 0;
    }
    else {
      if (iVar3 == 8) {
        pcVar6 = "Internal error initializing compression library: Invalid or unsupported options";
LAB_0025602a:
        iVar3 = -1;
      }
      else {
        if (iVar3 != 5) {
          pcVar6 = "Internal error initializing lzma library";
          goto LAB_0025602a;
        }
        pcVar6 = "Internal error initializing compression library: Cannot allocate memory";
        iVar3 = 0xc;
      }
      bVar2 = false;
      archive_set_error(&a->archive,iVar3,pcVar6);
      encoding = 0xffffffe2;
    }
  }
  else if (encoding != NONE) {
    if (encoding == GZIP) {
      if (*(int *)((long)pvVar1 + 0xd8) == 0) {
        iVar3 = inflateInit_((long)pvVar1 + 0x68,"1.2.11",0x70);
      }
      else {
        iVar3 = inflateReset();
      }
      if (iVar3 != 0) {
        pcVar6 = "Couldn\'t initialize zlib stream.";
        goto LAB_0025602a;
      }
      *(undefined4 *)((long)pvVar1 + 0xd8) = 1;
      encoding = NONE;
      *(undefined8 *)((long)pvVar1 + 0x78) = 0;
      *(undefined8 *)((long)pvVar1 + 0x90) = 0;
    }
    else {
      uVar4 = *(int *)((long)pvVar1 + 0x1f8) - 2;
      if (uVar4 < 3) {
        pcVar6 = &DAT_002d0bb0 + *(int *)(&DAT_002d0bb0 + (ulong)uVar4 * 4);
      }
      else {
        pcVar6 = "??";
      }
      bVar2 = false;
      archive_set_error(&a->archive,-1,"%s compression not supported on this platform",pcVar6);
      encoding = 0xffffffe7;
    }
  }
  if (!bVar2) {
    return encoding;
  }
  pvVar1 = a->format->data;
  *(int *)((long)pvVar1 + 0x170) = a_sum_alg;
  paVar5 = &__archive_digest;
  if (a_sum_alg == 1) {
    paVar5 = (archive_digest *)&__archive_digest.sha1init;
    lVar7 = 0x180;
  }
  else {
    if (a_sum_alg != 2) goto LAB_0025607e;
    lVar7 = 0x178;
  }
  (*paVar5->md5init)((archive_sha1_ctx *)(lVar7 + (long)pvVar1));
LAB_0025607e:
  *(int *)((long)pvVar1 + 0x188) = e_sum_alg;
  paVar5 = &__archive_digest;
  if (e_sum_alg == 1) {
    paVar5 = (archive_digest *)&__archive_digest.sha1init;
    lVar7 = 0x198;
  }
  else {
    if (e_sum_alg != 2) {
      return 0;
    }
    lVar7 = 400;
  }
  (*paVar5->md5init)((archive_sha1_ctx *)((long)pvVar1 + lVar7));
  return 0;
}

Assistant:

static int
rd_contents_init(struct archive_read *a, enum enctype encoding,
    int a_sum_alg, int e_sum_alg)
{
	int r;

	/* Init decompress library. */
	if ((r = decompression_init(a, encoding)) != ARCHIVE_OK)
		return (r);
	/* Init checksum library. */
	checksum_init(a, a_sum_alg, e_sum_alg);
	return (ARCHIVE_OK);
}